

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helpers.h
# Opt level: O2

bool cppwinrt::implements_interface(TypeDef *type,string_view *name)

{
  bool bVar1;
  value_type *impl;
  coded_index<winmd::reader::TypeDefOrRef> cVar2;
  TypeDef TVar3;
  InterfaceImpl __begin1;
  InterfaceImpl local_98;
  TypeDef *local_88;
  coded_index<winmd::reader::TypeDefOrRef> local_80;
  pair<winmd::reader::InterfaceImpl,_winmd::reader::InterfaceImpl> local_70;
  type_name local_50;
  
  local_88 = type;
  winmd::reader::TypeDef::InterfaceImpl(&local_70,type);
  local_98.super_row_base<winmd::reader::InterfaceImpl>._12_4_ =
       local_70.first.super_row_base<winmd::reader::InterfaceImpl>._12_4_;
  local_98.super_row_base<winmd::reader::InterfaceImpl>.m_index =
       local_70.first.super_row_base<winmd::reader::InterfaceImpl>.m_index;
  local_98.super_row_base<winmd::reader::InterfaceImpl>.m_table =
       local_70.first.super_row_base<winmd::reader::InterfaceImpl>.m_table;
  while ((local_98.super_row_base<winmd::reader::InterfaceImpl>.m_table !=
          local_70.second.super_row_base<winmd::reader::InterfaceImpl>.m_table ||
         (local_70.first.super_row_base<winmd::reader::InterfaceImpl>.m_index !=
          local_70.second.super_row_base<winmd::reader::InterfaceImpl>.m_index))) {
    cVar2 = winmd::reader::InterfaceImpl::Interface(&local_98);
    local_80.super_typed_index<winmd::reader::TypeDefOrRef>.
    super_index_base<winmd::reader::TypeDefOrRef>.m_table =
         cVar2.super_typed_index<winmd::reader::TypeDefOrRef>.
         super_index_base<winmd::reader::TypeDefOrRef>.m_table;
    local_80.super_typed_index<winmd::reader::TypeDefOrRef>.
    super_index_base<winmd::reader::TypeDefOrRef>.m_value =
         cVar2.super_typed_index<winmd::reader::TypeDefOrRef>.
         super_index_base<winmd::reader::TypeDefOrRef>.m_value;
    if ((local_80.super_typed_index<winmd::reader::TypeDefOrRef>.
         super_index_base<winmd::reader::TypeDefOrRef>.m_value & 3) != 2) {
      type_name::type_name(&local_50,&local_80);
      bVar1 = operator==(&local_50,name);
      if (bVar1) {
        return true;
      }
    }
    local_70.first.super_row_base<winmd::reader::InterfaceImpl>.m_index =
         local_98.super_row_base<winmd::reader::InterfaceImpl>.m_index + 1;
    local_98.super_row_base<winmd::reader::InterfaceImpl>.m_index =
         local_70.first.super_row_base<winmd::reader::InterfaceImpl>.m_index;
  }
  TVar3 = get_base_class(local_88);
  local_70.first.super_row_base<winmd::reader::InterfaceImpl>.m_table =
       TVar3.super_row_base<winmd::reader::TypeDef>.m_table;
  local_70.first.super_row_base<winmd::reader::InterfaceImpl>.m_index =
       TVar3.super_row_base<winmd::reader::TypeDef>.m_index;
  if (local_70.first.super_row_base<winmd::reader::InterfaceImpl>.m_table != (table_base *)0x0) {
    bVar1 = implements_interface((TypeDef *)&local_70,name);
    return bVar1;
  }
  return false;
}

Assistant:

static bool implements_interface(TypeDef const& type, std::string_view const& name)
    {
        for (auto&& impl : type.InterfaceImpl())
        {
            const auto iface = impl.Interface();
            if (iface.type() != TypeDefOrRef::TypeSpec && type_name(iface) == name)
            {
                return true;
            }
        }

        if (auto base = get_base_class(type))
        {
            return implements_interface(base, name);
        }
        else
        {
            return false;
        }
    }